

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O2

QTransform * __thiscall
QGraphicsItemPrivate::TransformData::computedFullTransform
          (QTransform *__return_storage_ptr__,TransformData *this,QTransform *postmultiplyTransform)

{
  long lVar1;
  QGraphicsTransform *pQVar2;
  bool bVar3;
  long lVar4;
  TransformData *pTVar5;
  float *pfVar6;
  QTransform *pQVar7;
  qreal *pqVar8;
  QMatrix4x4 *pQVar9;
  int i;
  ulong uVar10;
  long in_FS_OFFSET;
  byte bVar11;
  long lStack_d0;
  QTransform QStack_c8;
  QMatrix4x4 m;
  
  bVar11 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->onlyTransform == true) {
    pQVar7 = __return_storage_ptr__;
    if ((postmultiplyTransform == (QTransform *)0x0) ||
       (bVar3 = QTransform::isIdentity(postmultiplyTransform), bVar3)) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00581083;
      lStack_d0 = 10;
    }
    else {
      bVar3 = QTransform::isIdentity(&this->transform);
      if (!bVar3) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          QTransform::operator*(__return_storage_ptr__,&this->transform);
          return __return_storage_ptr__;
        }
LAB_00581083:
        __stack_chk_fail();
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00581083;
      lStack_d0 = 10;
      this = (TransformData *)postmultiplyTransform;
    }
    for (; lStack_d0 != 0; lStack_d0 = lStack_d0 + -1) {
      pQVar7->m_matrix[0][0] = (this->transform).m_matrix[0][0];
      this = (TransformData *)((long)this + (ulong)bVar11 * -0x10 + 8);
      pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar11 * -2 + 1) * 8);
    }
  }
  else {
    pTVar5 = this;
    pqVar8 = (qreal *)__return_storage_ptr__;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pqVar8 = (pTVar5->transform).m_matrix[0][0];
      pTVar5 = (TransformData *)((pTVar5->transform).m_matrix[0] + 1);
      pqVar8 = pqVar8 + 1;
    }
    if ((this->graphicsTransforms).d.size != 0) {
      pfVar6 = (float *)&DAT_00677800;
      pQVar9 = &m;
      for (lVar4 = 0x11; lVar4 != 0; lVar4 = lVar4 + -1) {
        pQVar9->m[0][0] = *pfVar6;
        pfVar6 = pfVar6 + 1;
        pQVar9 = (QMatrix4x4 *)(pQVar9->m[0] + 1);
      }
      QMatrix4x4::QMatrix4x4(&m);
      for (uVar10 = 0; uVar10 < (ulong)(this->graphicsTransforms).d.size; uVar10 = uVar10 + 1) {
        pQVar2 = (this->graphicsTransforms).d.ptr[uVar10];
        (**(code **)(*(long *)pQVar2 + 0x60))(pQVar2,&m);
      }
      QMatrix4x4::toTransform();
      QTransform::operator*=(__return_storage_ptr__,&QStack_c8);
    }
    QTransform::translate(this->xOrigin,this->yOrigin);
    QTransform::rotate(this->rotation,(Axis)__return_storage_ptr__);
    QTransform::scale(this->scale,this->scale);
    QTransform::translate(-this->xOrigin,-this->yOrigin);
    if (postmultiplyTransform != (QTransform *)0x0) {
      QTransform::operator*=(__return_storage_ptr__,postmultiplyTransform);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00581083;
  }
  return __return_storage_ptr__;
}

Assistant:

QTransform computedFullTransform(QTransform *postmultiplyTransform = nullptr) const
    {
        if (onlyTransform) {
            if (!postmultiplyTransform || postmultiplyTransform->isIdentity())
                return transform;
            if (transform.isIdentity())
                return *postmultiplyTransform;
            return transform * *postmultiplyTransform;
        }

        QTransform x(transform);
        if (!graphicsTransforms.isEmpty()) {
            QMatrix4x4 m;
            for (int i = 0; i < graphicsTransforms.size(); ++i)
                graphicsTransforms.at(i)->applyTo(&m);
            x *= m.toTransform();
        }
        x.translate(xOrigin, yOrigin);
        x.rotate(rotation);
        x.scale(scale, scale);
        x.translate(-xOrigin, -yOrigin);
        if (postmultiplyTransform)
            x *= *postmultiplyTransform;
        return x;
    }